

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * wabt::GetTypeName(Type type)

{
  char *pcVar1;
  
  switch(type) {
  case Any:
    pcVar1 = "any";
    break;
  case Anyfunc:
    pcVar1 = "anyfunc";
    break;
  case V128:
    pcVar1 = "v128";
    break;
  case F64:
    pcVar1 = "f64";
    break;
  case F32:
    pcVar1 = "f32";
    break;
  case I64:
    pcVar1 = "i64";
    break;
  case I32:
    pcVar1 = "i32";
    break;
  default:
    if (type == Void) {
      return "void";
    }
    if (type == Func) {
      return "func";
    }
    if (type == ExceptRef) {
      return "except_ref";
    }
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case 0xfffffff4:
  case 0xfffffff5:
  case 0xfffffff6:
  case 0xfffffff7:
  case 0xfffffff8:
  case 0xfffffff9:
  case 0xfffffffa:
    pcVar1 = "<type index>";
  }
  return pcVar1;
}

Assistant:

static WABT_INLINE const char* GetTypeName(Type type) {
  switch (type) {
    case Type::I32:
      return "i32";
    case Type::I64:
      return "i64";
    case Type::F32:
      return "f32";
    case Type::F64:
      return "f64";
    case Type::V128:
      return "v128";
    case Type::Anyfunc:
      return "anyfunc";
    case Type::Func:
      return "func";
    case Type::ExceptRef:
      return "except_ref";
    case Type::Void:
      return "void";
    case Type::Any:
      return "any";
    default:
      return "<type index>";
  }
  WABT_UNREACHABLE;
}